

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

void anurbs::NurbsSurfaceGeometry<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_00;
  module *m_00;
  class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
  *pcVar1;
  class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  local_500;
  bool local_4f1;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *local_4f0;
  module *local_4e8;
  arg local_4e0;
  arg local_4d0;
  arg local_4c0;
  arg local_4b0;
  string name;
  arg_v local_480;
  arg local_440;
  arg local_430;
  code *local_420;
  undefined8 local_418;
  arg local_410;
  arg local_400;
  code *local_3f0;
  undefined8 local_3e8;
  arg local_3e0;
  arg local_3d0;
  code *local_3c0;
  undefined8 local_3b8;
  arg local_3b0;
  arg local_3a0;
  code *local_390;
  undefined8 local_388;
  arg local_380;
  code *local_370;
  undefined8 local_368;
  arg local_360;
  arg local_350;
  arg local_340;
  arg local_330;
  arg local_320;
  code *local_310;
  undefined8 local_308;
  arg local_300;
  arg local_2f0;
  arg local_2e0;
  code *local_2d0;
  undefined8 local_2c8;
  arg local_2c0;
  arg local_2b0;
  code *local_2a0;
  undefined8 local_298;
  arg local_290;
  code *local_280;
  undefined8 local_278;
  arg local_270;
  code *local_260;
  undefined8 local_258;
  arg local_250;
  code *local_240;
  undefined8 local_238;
  code *local_230;
  undefined8 local_228;
  code *local_220;
  undefined8 local_218;
  code *local_210;
  undefined8 local_208;
  code *local_200;
  undefined8 local_1f8;
  code *local_1f0;
  undefined8 local_1e8;
  code *local_1e0;
  undefined8 local_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  code *local_1c0;
  undefined8 local_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  code *local_1a0;
  undefined8 local_198;
  code *local_190;
  undefined8 local_188;
  code *local_180;
  undefined8 local_178;
  code *local_170;
  undefined8 local_168;
  code *local_160;
  undefined8 local_158;
  code *local_150;
  undefined8 local_148;
  arg local_140;
  arg local_130;
  arg local_120;
  arg local_110;
  arg local_100;
  arg local_f0;
  arg local_e0;
  arg local_d0;
  arg local_c0;
  arg local_b0;
  arg local_a0;
  arg local_90;
  arg local_80;
  arg local_70;
  arg local_60;
  arg local_50;
  arg local_40;
  
  python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
  ::class_<>(&local_500,(m->super_object).super_handle.m_ptr,name._M_dataplus._M_p);
  local_4b0.name = "degree_u";
  local_4b0._8_1_ = 2;
  local_4c0.name = "degree_v";
  local_4c0._8_1_ = 2;
  local_4d0.name = "nb_poles_u";
  local_4d0._8_1_ = 2;
  local_4e0.name = "nb_poles_v";
  local_4e0._8_1_ = 2;
  local_4f1 = false;
  local_40.name = "is_rational";
  local_40._8_1_ = 2;
  pybind11::arg::operator=(&local_480,&local_40,&local_4f1);
  local_4f0 = model;
  local_4e8 = m;
  pybind11::detail::initimpl::
  constructor<const_long,_const_long,_const_long,_const_long,_const_bool>::
  execute<pybind11::class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_0>
            (&local_500,&local_4b0,&local_4c0,&local_4d0,&local_4e0,&local_480);
  local_50.name = "degree_u";
  local_50._8_1_ = 2;
  local_60.name = "degree_v";
  local_60._8_1_ = 2;
  local_70.name = "knots_u";
  local_70._8_1_ = 2;
  local_80.name = "knots_v";
  local_80._8_1_ = 2;
  local_90.name = "poles";
  local_90._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<const_long,_const_long,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>_>
  ::
  execute<pybind11::class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            (&local_500,&local_50,&local_60,&local_70,&local_80,&local_90);
  local_a0.name = "degree_u";
  local_a0._8_1_ = 2;
  local_b0.name = "degree_v";
  local_b0._8_1_ = 2;
  local_c0.name = "knots_u";
  local_c0._8_1_ = 2;
  local_d0.name = "knots_v";
  local_d0._8_1_ = 2;
  local_e0.name = "poles";
  local_e0._8_1_ = 2;
  local_f0.name = "weights";
  local_f0._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<const_long,_const_long,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::
  execute<pybind11::class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            (&local_500,&local_a0,&local_b0,&local_c0,&local_d0,&local_e0,&local_f0);
  local_100.name = "degree_u";
  local_100._8_1_ = 2;
  local_110.name = "degree_v";
  local_110._8_1_ = 2;
  local_120.name = "knots_u";
  local_120._8_1_ = 2;
  local_130.name = "knots_v";
  local_130._8_1_ = 2;
  local_140.name = "control_points";
  local_140._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<const_long,_const_long,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>_>
  ::
  execute<pybind11::class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            (&local_500,&local_100,&local_110,&local_120,&local_130,&local_140);
  local_150 = NurbsSurfaceGeometry<3L>::is_rational;
  local_148 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<bool(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        ((class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
                          *)&local_500,"is_rational",(offset_in_Model_to_subr *)&local_150);
  local_160 = NurbsSurfaceGeometry<3L>::nb_knots_u;
  local_158 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_knots_u",(offset_in_Model_to_subr *)&local_160);
  local_170 = NurbsSurfaceGeometry<3L>::nb_knots_v;
  local_168 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_knots_v",(offset_in_Model_to_subr *)&local_170);
  local_180 = NurbsSurfaceGeometry<3L>::nb_poles;
  local_178 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles",(offset_in_Model_to_subr *)&local_180);
  local_190 = NurbsSurfaceGeometry<3L>::nb_poles_u;
  local_188 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles_u",(offset_in_Model_to_subr *)&local_190);
  local_1a0 = NurbsSurfaceGeometry<3L>::nb_poles_v;
  local_198 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsSurfaceGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles_v",(offset_in_Model_to_subr *)&local_1a0);
  local_1b0 = NurbsSurfaceGeometry<3L>::knots_u;
  local_1a8 = 0;
  local_1c0 = NurbsSurfaceGeometry<3L>::set_knots_u;
  local_1b8 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(),void(anurbs::NurbsSurfaceGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots_u",(offset_in_Model_to_subr *)&local_1b0,
                         (offset_in_Model_to_subr *)&local_1c0);
  local_1d0 = NurbsSurfaceGeometry<3L>::knots_v;
  local_1c8 = 0;
  local_1e0 = NurbsSurfaceGeometry<3L>::set_knots_v;
  local_1d8 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(),void(anurbs::NurbsSurfaceGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots_v",(offset_in_Model_to_subr *)&local_1d0,
                         (offset_in_Model_to_subr *)&local_1e0);
  local_1f0 = NurbsSurfaceGeometry<3L>::poles;
  local_1e8 = 0;
  local_200 = NurbsSurfaceGeometry<3L>::set_poles;
  local_1f8 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(),void(anurbs::NurbsSurfaceGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>)>
                        (pcVar1,"poles",(offset_in_Model_to_subr *)&local_1f0,
                         (offset_in_Model_to_subr *)&local_200);
  local_210 = NurbsSurfaceGeometry<3L>::weights;
  local_208 = 0;
  local_220 = NurbsSurfaceGeometry<3L>::set_weights;
  local_218 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(),void(anurbs::NurbsSurfaceGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"weights",(offset_in_Model_to_subr *)&local_210,
                         (offset_in_Model_to_subr *)&local_220);
  local_230 = NurbsSurfaceGeometry<3L>::clone;
  local_228 = 0;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>(anurbs::NurbsSurfaceGeometry<3l>::*)()>
                        (pcVar1,"clone",(offset_in_Model_to_subr *)&local_230);
  local_240 = NurbsSurfaceGeometry<3L>::knot_u;
  local_238 = 0;
  local_250.name = "index";
  local_250._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def<double&(anurbs::NurbsSurfaceGeometry<3l>::*)(long),pybind11::arg>
                        (pcVar1,"knot_u",(offset_in_Model_to_subr *)&local_240,&local_250);
  local_260 = NurbsSurfaceGeometry<3L>::knot_v;
  local_258 = 0;
  local_270.name = "index";
  local_270._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def<double&(anurbs::NurbsSurfaceGeometry<3l>::*)(long),pybind11::arg>
                        (pcVar1,"knot_v",(offset_in_Model_to_subr *)&local_260,&local_270);
  local_280 = NurbsSurfaceGeometry<3L>::pole;
  local_278 = 0;
  local_290.name = "index";
  local_290._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<Eigen::Matrix<double,1,3,1,1,3>(anurbs::NurbsSurfaceGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"pole",(offset_in_Model_to_subr *)&local_280,&local_290);
  local_2a0 = NurbsSurfaceGeometry<3L>::pole;
  local_298 = 0;
  local_2b0.name = "index_u";
  local_2b0._8_1_ = 2;
  local_2c0.name = "index_v";
  local_2c0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<Eigen::Matrix<double,1,3,1,1,3>(anurbs::NurbsSurfaceGeometry<3l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"pole",(offset_in_Model_to_subr *)&local_2a0,&local_2b0,&local_2c0);
  local_2d0 = NurbsSurfaceGeometry<3L>::shape_functions_at;
  local_2c8 = 0;
  local_2e0.name = "u";
  local_2e0._8_1_ = 2;
  local_2f0.name = "v";
  local_2f0._8_1_ = 2;
  local_300.name = "order";
  local_300._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(double,double,long)const,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at",(offset_in_Model_to_subr *)&local_2d0,
                         &local_2e0,&local_2f0,&local_300);
  local_310 = NurbsSurfaceGeometry<3L>::shape_functions_at_span;
  local_308 = 0;
  local_320.name = "u";
  local_320._8_1_ = 2;
  local_330.name = "v";
  local_330._8_1_ = 2;
  local_340.name = "span_u";
  local_340._8_1_ = 2;
  local_350.name = "span_v";
  local_350._8_1_ = 2;
  local_360.name = "order";
  local_360._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(double,double,long,long,long)const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at_span",(offset_in_Model_to_subr *)&local_310,
                         &local_320,&local_330,&local_340,&local_350,&local_360);
  local_370 = NurbsSurfaceGeometry<3L>::weight;
  local_368 = 0;
  local_380.name = "index";
  local_380._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::def<double(anurbs::NurbsSurfaceGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"weight",(offset_in_Model_to_subr *)&local_370,&local_380);
  local_390 = NurbsSurfaceGeometry<3L>::weight;
  local_388 = 0;
  local_3a0.name = "index_u";
  local_3a0._8_1_ = 2;
  local_3b0.name = "index_v";
  local_3b0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<double(anurbs::NurbsSurfaceGeometry<3l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"weight",(offset_in_Model_to_subr *)&local_390,&local_3a0,&local_3b0
                        );
  local_3c0 = NurbsSurfaceGeometry<3L>::greville_point;
  local_3b8 = 0;
  local_3d0.name = "index_u";
  local_3d0._8_1_ = 2;
  local_3e0.name = "index_v";
  local_3e0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::pair<double,double>(anurbs::NurbsSurfaceGeometry<3l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"greville_point",(offset_in_Model_to_subr *)&local_3c0,&local_3d0,
                         &local_3e0);
  local_3f0 = NurbsSurfaceGeometry<3L>::nonzero_pole_indices_at_span;
  local_3e8 = 0;
  local_400.name = "span_u";
  local_400._8_1_ = 2;
  local_410.name = "span_v";
  local_410._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
              ::
              def<std::vector<long,std::allocator<long>>(anurbs::NurbsSurfaceGeometry<3l>::*)(long,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"nonzero_pole_indices_at_span",(offset_in_Model_to_subr *)&local_3f0
                         ,&local_400,&local_410);
  m_00 = local_4e8;
  local_420 = NurbsSurfaceGeometry<3L>::span_at;
  local_418 = 0;
  local_430.name = "u";
  local_430._8_1_ = 2;
  local_440.name = "v";
  local_440._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
  ::
  def<std::pair<long,long>(anurbs::NurbsSurfaceGeometry<3l>::*)(double,double)const,pybind11::arg,pybind11::arg>
            (pcVar1,"span_at",(offset_in_Model_to_subr *)&local_420,&local_430,&local_440);
  model_00 = local_4f0;
  pybind11::arg_v::~arg_v(&local_480);
  pybind11::object::~object((object *)&local_500);
  pybind11::module::
  def<anurbs::NurbsSurfaceGeometry<3l>::register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>(pybind11::module&,pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>&)::_lambda(anurbs::Model&,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>)_1_>
            (m_00,"add",(type *)&local_480);
  Model::register_python_data_type<anurbs::NurbsSurfaceGeometry<3l>>(m_00,model_00);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = NurbsSurfaceGeometry<TDimension>;
        using Base = SurfaceBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Index, const Index, const Index, const Index, const bool>(), "degree_u"_a, "degree_v"_a, "nb_poles_u"_a, "nb_poles_v"_a, "is_rational"_a = false)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const Poles>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "poles"_a)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const Poles, const Eigen::VectorXd>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "poles"_a, "weights"_a)
            .def(py::init<const Index, const Index, const Eigen::VectorXd, const Eigen::VectorXd, const std::vector<ControlPoint>>(), "degree_u"_a, "degree_v"_a, "knots_u"_a, "knots_v"_a, "control_points"_a)
            // read-only properties
            .def_property_readonly("is_rational", &Type::is_rational)
            .def_property_readonly("nb_knots_u", &Type::nb_knots_u)
            .def_property_readonly("nb_knots_v", &Type::nb_knots_v)
            .def_property_readonly("nb_poles", &Type::nb_poles)
            .def_property_readonly("nb_poles_u", &Type::nb_poles_u)
            .def_property_readonly("nb_poles_v", &Type::nb_poles_v)
            // properties
            .def_property("knots_u", py::overload_cast<>(&Type::knots_u), &Type::set_knots_u)
            .def_property("knots_v", py::overload_cast<>(&Type::knots_v), &Type::set_knots_v)
            .def_property("poles", py::overload_cast<>(&Type::poles), &Type::set_poles)
            .def_property("weights", py::overload_cast<>(&Type::weights), &Type::set_weights)
            // methods
            .def("clone", &Type::clone)
            .def("knot_u", py::overload_cast<Index>(&Type::knot_u), "index"_a)
            .def("knot_v", py::overload_cast<Index>(&Type::knot_v), "index"_a)
            .def("pole", (Vector(Type::*)(const Index) const) & Type::pole, "index"_a)
            .def("pole", (Vector(Type::*)(const Index, const Index) const) & Type::pole, "index_u"_a, "index_v"_a)
            .def("shape_functions_at", &Type::shape_functions_at, "u"_a, "v"_a, "order"_a)
            .def("shape_functions_at_span", &Type::shape_functions_at_span, "u"_a, "v"_a, "span_u"_a, "span_v"_a, "order"_a)
            .def("weight", (double (Type::*)(const Index) const) & Type::weight, "index"_a)
            .def("weight", (double (Type::*)(const Index, const Index) const) & Type::weight, "index_u"_a, "index_v"_a)
            .def("greville_point", &Type::greville_point, "index_u"_a, "index_v"_a)
            .def("nonzero_pole_indices_at_span", &Type::nonzero_pole_indices_at_span, "span_u"_a, "span_v"_a)
            .def("span_at", &Type::span_at, "u"_a, "v"_a);

        m.def("add", [](Model& model, Holder data) { model.add<Type>(data); });

        Model::register_python_data_type<Type>(m, model);
    }